

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedModel.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::LinkedModelFile::CopyFrom(LinkedModelFile *this,LinkedModelFile *from)

{
  if (from != this) {
    Clear(this);
    MergeFrom(this,from);
    return;
  }
  return;
}

Assistant:

void LinkedModelFile::CopyFrom(const LinkedModelFile& from) {
// @@protoc_insertion_point(class_specific_copy_from_start:CoreML.Specification.LinkedModelFile)
  if (&from == this) return;
  Clear();
  MergeFrom(from);
}